

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_capabilities.cpp
# Opt level: O3

void __thiscall
pfederc::Parser::parseCapabilityEnsure
          (Parser *this,
          vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          *requires,
          vector<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
          *ensures)

{
  Lexer *pLVar1;
  Token *pTVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  pointer *__ptr;
  char cVar7;
  string str;
  _Head_base<0UL,_pfederc::Expr_*,_false> local_58 [2];
  pointer local_48;
  
  sanityExpect(this,TOK_ENSURE);
  pLVar1 = this->lexer;
  pTVar2 = pLVar1->currentToken;
  bVar4 = Token::operator!=(pTVar2,TOK_ID);
  if (!bVar4) {
    (*pTVar2->_vptr_Token[2])(local_58,pTVar2,pLVar1);
    iVar5 = std::__cxx11::string::compare((char *)local_58);
    if (iVar5 == 0) {
      cVar7 = '\x01';
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)local_58);
      cVar7 = (iVar5 == 0) * '\x02';
    }
    if (local_58[0]._M_head_impl != (Expr *)&local_48) {
      operator_delete(local_58[0]._M_head_impl,
                      (ulong)((long)&(local_48->_M_t).
                                     super___uniq_ptr_impl<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                                     .
                                     super__Head_base<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_false>
                                     ._M_head_impl + 1));
    }
    if (cVar7 != '\0') {
      Lexer::next(this->lexer);
      if (cVar7 == '\x01') {
        requires = ensures;
      }
      bVar4 = false;
      goto LAB_0010f5da;
    }
  }
  pTVar2 = this->lexer->currentToken;
  local_58[0]._M_head_impl = (Expr *)operator_new(0x38);
  sVar3 = (pTVar2->pos).endIndex;
  *(Level *)&(local_58[0]._M_head_impl)->_vptr_Expr = LVL_ERROR;
  *(SyntaxErrorCode *)((long)&(local_58[0]._M_head_impl)->_vptr_Expr + 4) =
       STX_ERR_INVALID_CAPS_ENSURE;
  pLVar1 = (Lexer *)(pTVar2->pos).startIndex;
  ((Position *)&(local_58[0]._M_head_impl)->parent)->line = (pTVar2->pos).line;
  (local_58[0]._M_head_impl)->lexer = pLVar1;
  *(size_t *)&(local_58[0]._M_head_impl)->type = sVar3;
  (((_Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_> *)
   &((local_58[0]._M_head_impl)->pos).line)->_M_impl).super__Vector_impl_data._M_start =
       (pointer)0x0;
  ((local_58[0]._M_head_impl)->pos).startIndex = 0;
  ((local_58[0]._M_head_impl)->pos).endIndex = 0;
  generateError((Parser *)&stack0xffffffffffffffc8,
                (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                 *)this);
  std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
            ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
             &stack0xffffffffffffffc8);
  if (local_58[0]._M_head_impl != (Expr *)0x0) {
    std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
              ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)local_58,
               (Error<pfederc::SyntaxErrorCode> *)local_58[0]._M_head_impl);
  }
  uVar6 = (ulong)this->lexer->currentToken->type;
  bVar4 = true;
  if ((0x2c < uVar6) || ((0x100000000006U >> (uVar6 & 0x3f) & 1) == 0)) {
    Lexer::next(this->lexer);
  }
LAB_0010f5da:
  parseExpression((Parser *)local_58,(Precedence)this);
  if (local_58[0]._M_head_impl != (Expr *)0x0 && !bVar4) {
    std::
    vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>
    ::emplace_back<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
              ((vector<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>,std::allocator<std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>>
                *)requires,
               (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)local_58);
  }
  if (local_58[0]._M_head_impl != (Expr *)0x0) {
    (*(code *)((pointer)(local_58[0]._M_head_impl)->_vptr_Expr)[1]._M_t.
              super___uniq_ptr_impl<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
              .super__Head_base<0UL,_pfederc::Error<pfederc::SyntaxErrorCode>_*,_false>)();
  }
  return;
}

Assistant:

void Parser::parseCapabilityEnsure(std::vector<std::unique_ptr<Expr>> &requires,
    std::vector<std::unique_ptr<Expr>> &ensures) noexcept {
  Position pos(lexer.getCurrentToken()->getPosition());
  sanityExpect(TokenType::TOK_ENSURE);

  bool err = false;

  const Token *const tokCmd = lexer.getCurrentToken();
  uint8_t capstype = _CAPS_ENSURE_INVALID;
  if ((capstype = _getCapsEnsure(tokCmd, getLexer())) == _CAPS_ENSURE_INVALID) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_INVALID_CAPS_ENSURE, lexer.getCurrentToken()->getPosition()));
    switch (lexer.getCurrentToken()->getType()) {
    case TokenType::TOK_EOF:
    case TokenType::TOK_EOL:
    case TokenType::TOK_STMT:
      break;
    default:
      lexer.next();
      break;
    }

    err = true;
  } else {
    lexer.next();
  }

  std::unique_ptr<Expr> expr(parseExpression());
  if (!expr)
    err = true;

  if (err)
    return;

  if (capstype == _CAPS_ENSURE_ENSURES)
    ensures.push_back(std::move(expr));
  else
    requires.push_back(std::move(expr));
}